

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O2

void __thiscall
rsg::BinaryVecOp<4,_true,_true,_false,_rsg::ComputeMulRange,_rsg::EvaluateMul>::BinaryVecOp
          (BinaryVecOp<4,_true,_true,_false,_rsg::ComputeMulRange,_rsg::EvaluateMul> *this,
          GeneratorState *state,Type operatorToken,ConstValueRangeAccess inValueRange)

{
  ValueRange *this_00;
  ValueRange *this_01;
  Scalar *pSVar1;
  int iVar2;
  int iVar3;
  Scalar SVar4;
  pointer pSVar5;
  pointer pSVar6;
  ValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  bool bVar7;
  Type TVar8;
  pointer pSVar9;
  VariableType *pVVar10;
  VariableType *pVVar11;
  VariableType *pVVar12;
  long lVar13;
  pointer pSVar14;
  VariableType **bMax;
  pointer pSVar15;
  pointer pSVar16;
  Scalar *aMax;
  ComputeMulRange *this_02;
  float *pfVar17;
  float *bMin;
  pointer pSVar19;
  float *aMin;
  long local_208;
  vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_> baseTypes;
  ValueRange local_180;
  undefined1 local_100 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  int local_d8;
  VariableType *local_d0;
  pointer pMStack_c8;
  pointer local_c0;
  pointer pMStack_b8;
  ValueRange valueRange;
  pointer pSVar18;
  
  BinaryOp<4,_(rsg::Associativity)0>::BinaryOp
            (&this->super_BinaryOp<4,_(rsg::Associativity)0>,operatorToken);
  (this->super_BinaryOp<4,_(rsg::Associativity)0>).super_Expression._vptr_Expression =
       (_func_int **)&PTR__BinaryOp_00c47148;
  ValueRange::ValueRange(&valueRange,inValueRange);
  if (valueRange.m_type.m_baseType == TYPE_VOID) {
    iVar2 = state->m_shaderParams->maxExpressionDepth;
    iVar3 = state->m_expressionDepth;
    baseTypes.super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    baseTypes.super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    baseTypes.super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_180.m_type.m_baseType = TYPE_FLOAT;
    std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::
    emplace_back<rsg::VariableType::Type>(&baseTypes,(Type *)&local_180);
    local_180.m_type.m_baseType = 2;
    std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::
    emplace_back<rsg::VariableType::Type>(&baseTypes,(Type *)&local_180);
    TVar8 = de::Random::
            choose<rsg::VariableType::Type,__gnu_cxx::__normal_iterator<rsg::VariableType::Type*,std::vector<rsg::VariableType::Type,std::allocator<rsg::VariableType::Type>>>>
                      (state->m_random,
                       (__normal_iterator<rsg::VariableType::Type_*,_std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>_>
                        )baseTypes.
                         super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<rsg::VariableType::Type_*,_std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>_>
                        )baseTypes.
                         super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    local_d8 = de::Random::getInt(state->m_random,1,(uint)(2 < iVar2 - iVar3) * 3 + 1);
    local_100._8_8_ = &local_e8;
    local_100._4_4_ = 0;
    local_100._0_4_ = TVar8;
    local_100._16_8_ = 0;
    local_e8._M_local_buf[0] = '\0';
    local_d0 = (VariableType *)0x0;
    pMStack_c8 = (pointer)0x0;
    local_c0 = (pointer)0x0;
    pMStack_b8 = (pointer)0x0;
    ValueRange::ValueRange(&local_180,(VariableType *)local_100);
    ValueRange::operator=(&valueRange,&local_180);
    ValueRange::~ValueRange(&local_180);
    VariableType::~VariableType((VariableType *)local_100);
    pSVar9 = valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar9 = (Scalar *)0x0;
    }
    pSVar19 = valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar19 = (Scalar *)0x0;
    }
    valueRange_00.super_ConstValueRangeAccess.m_min = pSVar9;
    valueRange_00.super_ConstValueRangeAccess.m_type = &valueRange.m_type;
    valueRange_00.super_ConstValueRangeAccess.m_max = pSVar19;
    computeRandomValueRange(state,valueRange_00);
    std::_Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::
    ~_Vector_base(&baseTypes.
                   super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                 );
  }
  pVVar10 = &(this->super_BinaryOp<4,_(rsg::Associativity)0>).m_type;
  VariableType::operator=(pVVar10,&valueRange.m_type);
  ValueStorage<64>::setStorage(&(this->super_BinaryOp<4,_(rsg::Associativity)0>).m_value,pVVar10);
  ValueRange::ValueRange(&local_180,pVVar10);
  this_01 = &(this->super_BinaryOp<4,_(rsg::Associativity)0>).m_rightValueRange;
  ValueRange::operator=(this_01,&local_180);
  ValueRange::~ValueRange(&local_180);
  ValueRange::ValueRange(&local_180,pVVar10);
  this_00 = &(this->super_BinaryOp<4,_(rsg::Associativity)0>).m_leftValueRange;
  ValueRange::operator=(this_00,&local_180);
  ValueRange::~ValueRange(&local_180);
  TVar8 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_type.m_baseType;
  local_208 = 0;
  for (lVar13 = 0;
      pSVar18 = valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_finish,
      pSVar15 = valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_start,
      pSVar19 = valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_finish,
      pSVar9 = valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
               _M_impl.super__Vector_impl_data._M_start,
      lVar13 < (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_type.m_numElements;
      lVar13 = lVar13 + 1) {
    pVVar10 = VariableType::getElementType(&valueRange.m_type);
    if (pSVar15 == pSVar18) {
      pSVar15 = (pointer)0x0;
    }
    if (pSVar9 == pSVar19) {
      pSVar9 = (pointer)0x0;
    }
    pSVar19 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_leftValueRange.m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar18 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_leftValueRange.m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pSVar16 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_leftValueRange.m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar5 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_leftValueRange.m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pVVar11 = VariableType::getElementType(&this_00->m_type);
    if (pSVar16 == pSVar5) {
      pSVar16 = (pointer)0x0;
    }
    if (pSVar19 == pSVar18) {
      pSVar19 = (pointer)0x0;
    }
    pSVar18 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_rightValueRange.m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar5 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_rightValueRange.m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar14 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_rightValueRange.m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar6 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_rightValueRange.m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this_02 = (ComputeMulRange *)this_01;
    pVVar12 = VariableType::getElementType(&this_01->m_type);
    pfVar17 = (float *)((long)pSVar9 + local_208);
    pSVar1 = (Scalar *)((long)pSVar15 + local_208);
    aMin = (float *)((long)pSVar19 + local_208);
    aMax = (Scalar *)((long)pSVar16 + local_208);
    if (pSVar14 == pSVar6) {
      pSVar14 = (pointer)0x0;
    }
    if (pSVar18 == pSVar5) {
      pSVar18 = (pointer)0x0;
    }
    bMin = (float *)((long)pSVar18 + local_208);
    bMax = (VariableType **)((long)pSVar14 + local_208);
    if ((TVar8 - TYPE_FLOAT < 2) &&
       (valueRange_01.m_min = (Scalar *)pfVar17, valueRange_01.m_type = pVVar10,
       valueRange_01.m_max = pSVar1, bVar7 = isUndefinedValueRange(valueRange_01), bVar7)) {
      local_180.m_type._0_8_ = pVVar10;
      local_180.m_type.m_typeName._M_dataplus._M_p = (pointer)pfVar17;
      local_100._0_8_ = pVVar11;
      local_100._8_8_ = aMin;
      StridedValueAccess<1>::operator=
                ((StridedValueAccess<1> *)local_100,(StridedValueRead<1> *)&local_180);
      local_180.m_type._0_8_ = pVVar10;
      local_180.m_type.m_typeName._M_dataplus._M_p = (pointer)pfVar17;
      local_100._0_8_ = pVVar12;
      local_100._8_8_ = bMin;
      StridedValueAccess<1>::operator=
                ((StridedValueAccess<1> *)local_100,(StridedValueRead<1> *)&local_180);
      local_180.m_type._0_8_ = pVVar10;
      local_180.m_type.m_typeName._M_dataplus._M_p = (pointer)pSVar1;
      local_100._0_8_ = pVVar11;
      local_100._8_8_ = aMax;
      StridedValueAccess<1>::operator=
                ((StridedValueAccess<1> *)local_100,(StridedValueRead<1> *)&local_180);
      local_180.m_type._0_8_ = pVVar10;
      local_180.m_type.m_typeName._M_dataplus._M_p = (pointer)pSVar1;
      local_100._0_8_ = pVVar12;
      local_100._8_8_ = bMax;
      StridedValueAccess<1>::operator=
                ((StridedValueAccess<1> *)local_100,(StridedValueRead<1> *)&local_180);
    }
    else if (TVar8 == TYPE_INT) {
      SVar4.floatVal = *(float *)pSVar1;
      *aMin = *pfVar17;
      aMax->floatVal = (float)SVar4;
      *bMin = 1.4013e-45;
      *(float *)bMax = 1.4013e-45;
    }
    else if (TVar8 == TYPE_FLOAT) {
      ComputeMulRange::operator()
                (this_02,state->m_random,*pfVar17,pSVar1->floatVal,aMin,&aMax->floatVal,bMin,
                 (float *)bMax);
    }
    local_208 = local_208 + 4;
  }
  ValueRange::~ValueRange(&valueRange);
  return;
}

Assistant:

BinaryVecOp<Precedence, Float, Int, Bool, ComputeValueRange, EvaluateComp>::BinaryVecOp (GeneratorState& state, Token::Type operatorToken, ConstValueRangeAccess inValueRange)
	: BinaryOp<Precedence, ASSOCIATIVITY_LEFT>(operatorToken)
{
	ValueRange valueRange = inValueRange;

	if (valueRange.getType().isVoid())
	{
		int							availableLevels	= state.getShaderParameters().maxExpressionDepth - state.getExpressionDepth();
		vector<VariableType::Type>	baseTypes;

		if (Float)	baseTypes.push_back(VariableType::TYPE_FLOAT);
		if (Int)	baseTypes.push_back(VariableType::TYPE_INT);
		if (Bool)	baseTypes.push_back(VariableType::TYPE_BOOL);

		VariableType::Type	baseType	= state.getRandom().choose<VariableType::Type>(baseTypes.begin(), baseTypes.end());
		int					numElements	= state.getRandom().getInt(1, availableLevels >= 3 ? 4 : 1);

		valueRange = ValueRange(VariableType(baseType, numElements));
		computeRandomValueRange(state, valueRange.asAccess());
	}

	// Choose type, allocate storage for execution
	this->m_type = valueRange.getType();
	this->m_value.setStorage(this->m_type);

	// Initialize storage for value ranges
	this->m_rightValueRange	= ValueRange(this->m_type);
	this->m_leftValueRange	= ValueRange(this->m_type);

	VariableType::Type baseType = this->m_type.getBaseType();

	// Compute range for b that satisfies requested value range
	for (int elemNdx = 0; elemNdx < this->m_type.getNumElements(); elemNdx++)
	{
		ConstValueRangeAccess	dst		= valueRange.asAccess().component(elemNdx);
		ValueRangeAccess		a		= this->m_leftValueRange.asAccess().component(elemNdx); // \todo [2011-03-25 pyry] Commutative: randomize inputs
		ValueRangeAccess		b		= this->m_rightValueRange.asAccess().component(elemNdx);

		// Just pass undefined ranges
		if ((baseType == VariableType::TYPE_FLOAT || baseType == VariableType::TYPE_INT) && isUndefinedValueRange(dst))
		{
			a.getMin() = dst.getMin().value();
			b.getMin() = dst.getMin().value();
			a.getMax() = dst.getMax().value();
			b.getMax() = dst.getMax().value();
			continue;
		}

		if (baseType == VariableType::TYPE_FLOAT)
			ComputeValueRange()(state.getRandom(), dst.getMin().asFloat(), dst.getMax().asFloat(),
								a.getMin().asFloat(), a.getMax().asFloat(),
								b.getMin().asFloat(), b.getMax().asFloat());
		else if (baseType == VariableType::TYPE_INT)
			ComputeValueRange()(state.getRandom(), dst.getMin().asInt(), dst.getMax().asInt(),
								a.getMin().asInt(), a.getMax().asInt(),
								b.getMin().asInt(), b.getMax().asInt());
		else
		{
			DE_ASSERT(baseType == VariableType::TYPE_BOOL);
			ComputeValueRange()(state.getRandom(), dst.getMin().asBool(), dst.getMax().asBool(),
								a.getMin().asBool(), a.getMax().asBool(),
								b.getMin().asBool(), b.getMax().asBool());
		}
	}
}